

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrgload.c
# Opt level: O3

FT_Error pfr_glyph_line_to(PFR_Glyph glyph,FT_Vector *to)

{
  short *psVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  short sVar4;
  FT_Error FVar5;
  undefined8 *in_RDX;
  FT_GlyphLoader loader;
  
  if ((char)to == '\0') {
    return 8;
  }
  sVar4 = *(short *)((long)&glyph[1].loader + 2);
  if (*(uint *)&glyph->x_control < (int)*(short *)((long)&glyph->num_subs + 2) + (int)sVar4 + 1U) {
    FVar5 = FT_GlyphLoader_CheckPoints((FT_GlyphLoader)glyph,1,0);
    if (FVar5 != 0) {
      return FVar5;
    }
    sVar4 = *(short *)((long)&glyph[1].loader + 2);
  }
  uVar3 = in_RDX[1];
  puVar2 = (undefined8 *)(*(long *)&glyph[1].path_begun + (long)sVar4 * 0x10);
  *puVar2 = *in_RDX;
  puVar2[1] = uVar3;
  *(undefined1 *)(*(long *)(glyph + 2) + (long)sVar4) = 1;
  psVar1 = (short *)((long)&glyph[1].loader + 2);
  *psVar1 = *psVar1 + 1;
  return 0;
}

Assistant:

static FT_Error
  pfr_glyph_line_to( PFR_Glyph   glyph,
                     FT_Vector*  to )
  {
    FT_GlyphLoader  loader  = glyph->loader;
    FT_Outline*     outline = &loader->current.outline;
    FT_Error        error;


    /* check that we have begun a new path */
    if ( !glyph->path_begun )
    {
      error = FT_THROW( Invalid_Table );
      FT_ERROR(( "pfr_glyph_line_to: invalid glyph data\n" ));
      goto Exit;
    }

    error = FT_GLYPHLOADER_CHECK_POINTS( loader, 1, 0 );
    if ( !error )
    {
      FT_Int  n = outline->n_points;


      outline->points[n] = *to;
      outline->tags  [n] = FT_CURVE_TAG_ON;

      outline->n_points++;
    }

  Exit:
    return error;
  }